

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O1

_Bool btorsim_bv_is_one(BtorSimBitVector *bv)

{
  uint uVar1;
  uint32_t uVar2;
  long lVar3;
  bool bVar4;
  
  uVar1 = bv->len - 1;
  if ((&bv[1].width)[uVar1] != 1) {
    return false;
  }
  if (uVar1 != 0) {
    lVar3 = 2;
    do {
      bVar4 = (&bv->width)[lVar3] == 0;
      if (!bVar4) {
        return bVar4;
      }
      uVar2 = (uint32_t)lVar3;
      lVar3 = lVar3 + 1;
    } while (bv->len != uVar2);
    return bVar4;
  }
  return true;
}

Assistant:

bool
btorsim_bv_is_one (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i;

  if (bv->bits[bv->len - 1] != 1) return false;
  for (i = 0; i < bv->len - 1; i++)
    if (bv->bits[i] != 0) return false;
  return true;
}